

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::XFormWidget::setSelection(XFormWidget *this,int pickID,Selection *selection)

{
  _Rb_tree_header *p_Var1;
  mapped_type mVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  key_type_conflict local_14;
  
  p_Var3 = (this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->pickIDToAxis)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (pickID <= (int)p_Var3[1]._M_color) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < pickID];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= pickID)) {
      (selection->coordinates).x = 0.0;
      (selection->coordinates).y = 0.0;
      (selection->coordinates).z = 0.0;
      selection->axis = None;
      selection->object = &this->super_SceneObject;
      selection->element = (HalfedgeElement *)0x0;
      pmVar4 = std::
               map<int,_CMU462::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Selection::Axis>_>_>
               ::operator[](&this->pickIDToAxis,&local_14);
      mVar2 = *pmVar4;
      (this->target).axis = mVar2;
      selection->axis = mVar2;
      return;
    }
  }
  (this->target).axis = None;
  return;
}

Assistant:

void XFormWidget::setSelection( int pickID, Selection& selection )
{
   if( pickIDToAxis.find(pickID) != pickIDToAxis.end() )
   {
      selection.clear();
      selection.object = this;
      selection.element = nullptr;
      selection.axis = target.axis = pickIDToAxis[pickID];
   }
   else
   {
      target.axis = Selection::Axis::None;
   }
}